

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O2

void CreateBackwardReferencesNH3
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command_conflict *commands,
               size_t *num_commands,size_t *num_literals,
               BackwardReferenceFromDecoder *backward_references,size_t *back_refs_position,
               size_t back_refs_size)

{
  ulong uVar1;
  ushort uVar2;
  short sVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  ulong uVar11;
  ulong uVar12;
  uint8_t uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  bool bVar24;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f0;
  ulong local_d8 [3];
  size_t *local_c0;
  ulong local_b8;
  ulong local_b0;
  int local_a4;
  ulong local_a0;
  ulong local_98;
  ContextLut local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  long local_68;
  long local_60;
  long local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  BrotliEncoderParams *local_38;
  
  local_38 = params;
  local_b8 = (1L << (literal_context_lut[8] & 0x3f)) - 0x10;
  local_88 = (position - 7) + num_bytes;
  local_50 = position;
  if (7 < num_bytes) {
    local_50 = local_88;
  }
  local_58 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    local_58 = 0x40;
  }
  uVar1 = position + num_bytes;
  local_60 = (position - 1) + num_bytes;
  local_90 = literal_context_lut;
  local_68 = *(long *)(literal_context_lut + 0x10);
  local_120 = *(ulong *)dist_cache;
  uVar11 = local_58 + position;
  local_80 = ringbuffer_mask & 0xffffffff;
  local_70 = (ulong)(uint)((int)local_58 * 4);
  local_c0 = last_insert_len;
  uVar9 = local_70;
  do {
LAB_0010fa6f:
    uVar20 = position;
    if (uVar1 <= uVar20 + 8) {
      *(ulong *)dist_cache = (local_120 + uVar1) - uVar20;
      *(long *)commands = *(long *)commands + ((long)local_c0 - (long)last_insert_len >> 4);
      return;
    }
    local_110 = uVar1 - uVar20;
    uVar18 = local_b8;
    if (uVar20 < local_b8) {
      uVar18 = uVar20;
    }
    uVar16 = uVar20 & ringbuffer_mask;
    uVar13 = ringbuffer[uVar16];
    local_100 = (ulong)*(int *)&(hasher->common).extra;
    local_f0 = 0x7e4;
    local_80._0_4_ = (uint)ringbuffer_mask;
    if ((uVar20 - local_100 < uVar20) &&
       (uVar8 = (ulong)((uint)(uVar20 - local_100) & (uint)local_80), uVar13 == ringbuffer[uVar8]))
    {
      uVar15 = local_110 & 0xfffffffffffffff8;
      uVar21 = 0;
      lVar7 = 0;
LAB_0010faef:
      if (local_110 >> 3 == uVar21) {
        uVar12 = (ulong)((uint)local_110 & 7);
        for (; (bVar24 = uVar12 != 0, uVar12 = uVar12 - 1, uVar21 = local_110, bVar24 &&
               (uVar21 = uVar15, ringbuffer[uVar15 + uVar8] == ringbuffer[uVar15 + uVar16]));
            uVar15 = uVar15 + 1) {
        }
      }
      else {
        if (*(ulong *)(ringbuffer + uVar21 * 8 + uVar16) ==
            *(ulong *)(ringbuffer + uVar21 * 8 + uVar8)) break;
        uVar15 = *(ulong *)(ringbuffer + uVar21 * 8 + uVar8) ^
                 *(ulong *)(ringbuffer + uVar21 * 8 + uVar16);
        uVar8 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
          }
        }
        uVar21 = (uVar8 >> 3 & 0x1fffffff) - lVar7;
      }
      if ((uVar21 < 4) || (uVar8 = uVar21 * 0x87 + 0x78f, uVar8 < 0x7e5)) goto LAB_0010fb41;
      uVar13 = ringbuffer[uVar21 + uVar16];
      local_f0 = uVar8;
    }
    else {
LAB_0010fb41:
      local_100 = 0;
      uVar21 = 0;
    }
    lVar7 = *(long *)&(params->hasher).num_last_distances_to_check;
    local_d8[0] = (ulong)(*(long *)(ringbuffer + uVar16) * -0x42e1ca5843000000) >> 0x30;
    local_d8[1] = (ulong)((ushort)((ulong)(*(long *)(ringbuffer + uVar16) * -0x42e1ca5843000000) >>
                                  0x30) + 8 & 0xffff);
    local_b0 = (ulong)((uint)local_110 & 7);
    for (lVar17 = 0; lVar17 != 2; lVar17 = lVar17 + 1) {
      uVar5 = *(uint *)(lVar7 + local_d8[lVar17] * 4);
      uVar4 = (uint)local_80 & uVar5;
      if (((uVar13 == ringbuffer[uVar21 + uVar4]) && (uVar20 != uVar5)) &&
         (uVar8 = uVar20 - uVar5, uVar8 <= uVar18)) {
        uVar15 = 0;
        lVar22 = 0;
LAB_0010fbee:
        uVar12 = local_110 & 0xfffffffffffffff8;
        uVar23 = local_b0;
        if (local_110 >> 3 == uVar15) {
          for (; (uVar15 = local_110, uVar23 != 0 &&
                 (uVar15 = uVar12, ringbuffer[uVar12 + uVar4] == ringbuffer[uVar12 + uVar16]));
              uVar12 = uVar12 + 1) {
            uVar23 = uVar23 - 1;
          }
        }
        else {
          if (*(ulong *)(ringbuffer + uVar15 * 8 + uVar16) ==
              *(ulong *)(ringbuffer + uVar15 * 8 + (ulong)uVar4)) goto code_r0x0010fc00;
          uVar12 = *(ulong *)(ringbuffer + uVar15 * 8 + (ulong)uVar4) ^
                   *(ulong *)(ringbuffer + uVar15 * 8 + uVar16);
          uVar15 = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
            }
          }
          uVar15 = (uVar15 >> 3 & 0x1fffffff) - lVar22;
        }
        if (3 < uVar15) {
          iVar14 = 0x1f;
          if ((uint)uVar8 != 0) {
            for (; (uint)uVar8 >> iVar14 == 0; iVar14 = iVar14 + -1) {
            }
          }
          uVar12 = (ulong)(iVar14 * -0x1e + 0x780) + uVar15 * 0x87;
          if (local_f0 < uVar12) {
            uVar13 = ringbuffer[uVar15 + uVar16];
            uVar21 = uVar15;
            local_100 = uVar8;
            local_f0 = uVar12;
          }
        }
      }
    }
    *(uint *)(lVar7 + *(long *)((long)local_d8 + (ulong)((uint)uVar20 & 8)) * 4) = (uint)uVar20;
    if (local_f0 < 0x7e5) {
      local_120 = local_120 + 1;
      position = uVar20 + 1;
      if ((num_literals == (size_t *)0x0) && (uVar11 < position)) {
        if (uVar11 + uVar9 < position) {
          uVar18 = uVar20 + 0x11;
          if (local_88 <= uVar20 + 0x11) {
            uVar18 = local_88;
          }
          for (; position < uVar18; position = position + 4) {
            *(uint *)(lVar7 + (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                      (position & ringbuffer_mask))
                                                            * -0x42e1ca5843000000) >> 0x30) +
                                      ((uint)position & 8) & 0xffff) * 4) = (uint)position;
            local_120 = local_120 + 4;
          }
        }
        else {
          uVar18 = uVar20 + 9;
          if (local_88 <= uVar20 + 9) {
            uVar18 = local_88;
          }
          for (; position < uVar18; position = position + 2) {
            *(uint *)(lVar7 + (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                      (position & ringbuffer_mask))
                                                            * -0x42e1ca5843000000) >> 0x30) +
                                      ((uint)position & 8) & 0xffff) * 4) = (uint)position;
            local_120 = local_120 + 2;
          }
        }
      }
      goto LAB_0010fa6f;
    }
    local_98 = (ulong)*(int *)&(hasher->common).extra;
    local_78 = local_120 + 4;
    local_48 = local_60 - uVar20;
    local_a4 = 0;
    do {
      local_a0 = (ulong)((uint)local_48 & 7);
      local_110 = local_110 - 1;
      uVar11 = uVar21 - 1;
      if (local_110 <= uVar21 - 1) {
        uVar11 = local_110;
      }
      if (4 < *(int *)(literal_context_lut + 4)) {
        uVar11 = 0;
      }
      uVar9 = uVar20 + 1;
      local_b0 = local_b8;
      if (uVar9 < local_b8) {
        local_b0 = uVar9;
      }
      uVar18 = uVar9 & ringbuffer_mask;
      uVar13 = ringbuffer[uVar11 + uVar18];
      local_108 = 0x7e4;
      if ((uVar9 - local_98 < uVar9) &&
         (uVar5 = (uint)(uVar9 - local_98) & (uint)local_80, uVar13 == ringbuffer[uVar11 + uVar5]))
      {
        uVar16 = 0;
        lVar17 = 0;
LAB_0010fe4e:
        if (local_48 >> 3 == uVar16) {
          uVar16 = local_a0;
          for (local_118 = -lVar17;
              (bVar24 = uVar16 != 0, uVar16 = uVar16 - 1, bVar24 &&
              (ringbuffer[local_118 + uVar5] == ringbuffer[local_118 + uVar18]));
              local_118 = local_118 + 1) {
          }
        }
        else {
          if (*(ulong *)(ringbuffer + uVar16 * 8 + uVar18) ==
              *(ulong *)(ringbuffer + uVar16 * 8 + (ulong)uVar5)) goto code_r0x0010fe69;
          uVar8 = *(ulong *)(ringbuffer + uVar16 * 8 + (ulong)uVar5) ^
                  *(ulong *)(ringbuffer + uVar16 * 8 + uVar18);
          uVar16 = 0;
          if (uVar8 != 0) {
            for (; (uVar8 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
            }
          }
          local_118 = (uVar16 >> 3 & 0x1fffffff) - lVar17;
        }
        if ((local_118 < 4) || (uVar16 = local_118 * 0x87 + 0x78f, uVar16 < 0x7e5))
        goto LAB_0010febe;
        uVar13 = ringbuffer[local_118 + uVar18];
        uVar11 = local_118;
        local_128 = local_98;
        local_108 = uVar16;
      }
      else {
LAB_0010febe:
        local_128 = 0;
        local_118 = 0;
      }
      local_d8[0] = (ulong)(*(long *)(ringbuffer + uVar18) * -0x42e1ca5843000000) >> 0x30;
      local_d8[1] = (ulong)((ushort)((ulong)(*(long *)(ringbuffer + uVar18) * -0x42e1ca5843000000)
                                    >> 0x30) + 8 & 0xffff);
      local_40 = *(long *)((long)local_d8 + (ulong)((uint)uVar9 & 8));
      for (lVar17 = 0; lVar17 != 2; lVar17 = lVar17 + 1) {
        uVar5 = *(uint *)(lVar7 + local_d8[lVar17] * 4);
        uVar4 = (uint)local_80 & uVar5;
        if (((uVar13 == ringbuffer[uVar11 + uVar4]) && (uVar9 != uVar5)) &&
           (uVar16 = uVar9 - uVar5, uVar16 <= local_b0)) {
          uVar8 = 0;
          lVar22 = 0;
LAB_0010ff56:
          if (local_48 >> 3 == uVar8) {
            uVar15 = local_a0;
            for (uVar8 = -lVar22;
                (bVar24 = uVar15 != 0, uVar15 = uVar15 - 1, bVar24 &&
                (ringbuffer[uVar8 + uVar4] == ringbuffer[uVar8 + uVar18])); uVar8 = uVar8 + 1) {
            }
          }
          else {
            if (*(ulong *)(ringbuffer + uVar8 * 8 + uVar18) ==
                *(ulong *)(ringbuffer + uVar8 * 8 + (ulong)uVar4)) goto code_r0x0010ff6a;
            uVar15 = *(ulong *)(ringbuffer + uVar8 * 8 + (ulong)uVar4) ^
                     *(ulong *)(ringbuffer + uVar8 * 8 + uVar18);
            uVar8 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
              }
            }
            uVar8 = (uVar8 >> 3 & 0x1fffffff) - lVar22;
          }
          if (3 < uVar8) {
            iVar14 = 0x1f;
            if ((uint)uVar16 != 0) {
              for (; (uint)uVar16 >> iVar14 == 0; iVar14 = iVar14 + -1) {
              }
            }
            uVar15 = (ulong)(iVar14 * -0x1e + 0x780) + uVar8 * 0x87;
            if (local_108 < uVar15) {
              uVar13 = ringbuffer[uVar8 + uVar18];
              uVar11 = uVar8;
              local_128 = uVar16;
              local_118 = uVar8;
              local_108 = uVar15;
            }
          }
        }
      }
      *(uint *)(lVar7 + local_40 * 4) = (uint)uVar9;
      uVar11 = uVar20;
      uVar18 = local_120;
      if ((local_108 < local_f0 + 0xaf) ||
         (local_100 = local_128, uVar11 = uVar9, uVar21 = local_118, uVar18 = local_78,
         local_a4 == 3)) break;
      local_120 = local_120 + 1;
      local_a4 = local_a4 + 1;
      uVar16 = uVar20 + 9;
      local_48 = local_48 - 1;
      local_f0 = local_108;
      uVar20 = uVar9;
      uVar18 = local_120;
    } while (uVar16 < uVar1);
    local_120 = uVar18;
    uVar9 = local_68 + uVar11;
    if (local_b8 <= uVar9) {
      uVar9 = local_b8;
    }
    if (uVar9 < local_100) {
LAB_001100c3:
      uVar18 = local_100 + 0xf;
LAB_001100c7:
      if ((local_100 <= uVar9) && (uVar18 != 0)) {
        *(int *)((long)&(hasher->common).dict_num_lookups + 4) =
             (int)(hasher->common).dict_num_lookups;
        *(void **)((long)&(hasher->common).extra + 4) = (hasher->common).extra;
        *(int *)&(hasher->common).extra = (int)local_100;
      }
    }
    else {
      uVar20 = (ulong)*(int *)&(hasher->common).extra;
      if (local_100 != uVar20) {
        uVar16 = (ulong)*(int *)((long)&(hasher->common).extra + 4);
        uVar18 = 1;
        if (local_100 != uVar16) {
          uVar20 = (local_100 + 3) - uVar20;
          if (uVar20 < 7) {
            bVar10 = (byte)((int)uVar20 << 2);
            uVar5 = 0x9750468;
          }
          else {
            uVar16 = (local_100 + 3) - uVar16;
            if (6 < uVar16) {
              uVar18 = 2;
              if ((local_100 != (long)(int)(hasher->common).dict_num_lookups) &&
                 (uVar18 = 3,
                 local_100 != (long)*(int *)((long)&(hasher->common).dict_num_lookups + 4)))
              goto LAB_001100c3;
              goto LAB_001100c7;
            }
            bVar10 = (byte)((int)uVar16 << 2);
            uVar5 = 0xfdb1ace;
          }
          uVar18 = (ulong)(uVar5 >> (bVar10 & 0x1f) & 0xf);
        }
        goto LAB_001100c7;
      }
      uVar18 = 0;
    }
    uVar5 = (uint)local_120;
    *(uint *)local_c0 = uVar5;
    uVar6 = (uint)uVar21;
    *(uint *)((long)local_c0 + 4) = uVar6;
    uVar9 = (ulong)*(uint *)(literal_context_lut + 0x44) + 0x10;
    uVar4 = 0;
    if (uVar9 <= uVar18) {
      bVar10 = (byte)*(uint *)(literal_context_lut + 0x40);
      uVar20 = ((4L << (bVar10 & 0x3f)) + (uVar18 - *(uint *)(literal_context_lut + 0x44))) - 0x10;
      uVar4 = 0x1f;
      uVar19 = (uint)uVar20;
      if (uVar19 != 0) {
        for (; uVar19 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar4 = (uVar4 ^ 0xffffffe0) + 0x1f;
      uVar16 = (ulong)((uVar20 >> ((ulong)uVar4 & 0x3f) & 1) != 0);
      lVar17 = (ulong)uVar4 - (ulong)*(uint *)(literal_context_lut + 0x40);
      uVar18 = (~(-1 << (bVar10 & 0x1f)) & uVar19) + uVar9 +
               (uVar16 + lVar17 * 2 + 0xfffe << (bVar10 & 0x3f)) | lVar17 * 0x400;
      uVar4 = (uint)(uVar20 - (uVar16 + 2 << ((byte)uVar4 & 0x3f)) >> (bVar10 & 0x3f));
    }
    *(short *)((long)local_c0 + 0xe) = (short)uVar18;
    *(uint *)(local_c0 + 1) = uVar4;
    if (5 < local_120) {
      if (local_120 < 0x82) {
        uVar5 = 0x1f;
        uVar4 = (uint)(local_120 - 2);
        if (uVar4 != 0) {
          for (; uVar4 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar5 = (int)(local_120 - 2 >> ((char)(uVar5 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                (uVar5 ^ 0xffffffe0) * 2 + 0x40;
      }
      else if (local_120 < 0x842) {
        uVar4 = 0x1f;
        if (uVar5 - 0x42 != 0) {
          for (; uVar5 - 0x42 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        uVar5 = (uVar4 ^ 0xffe0) + 0x2a;
      }
      else {
        uVar5 = 0x15;
        if (0x1841 < local_120) {
          uVar5 = (uint)(ushort)(0x17 - (local_120 < 0x5842));
        }
      }
    }
    uVar9 = (ulong)(int)uVar6;
    if (uVar9 < 10) {
      uVar4 = uVar6 - 2;
    }
    else if (uVar9 < 0x86) {
      uVar4 = 0x1f;
      uVar6 = (uint)(uVar9 - 6);
      if (uVar6 != 0) {
        for (; uVar6 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar4 = (int)(uVar9 - 6 >> ((char)(uVar4 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
              (uVar4 ^ 0xffffffe0) * 2 + 0x42;
    }
    else {
      uVar4 = 0x17;
      if (uVar9 < 0x846) {
        uVar4 = 0x1f;
        if (uVar6 - 0x46 != 0) {
          for (; uVar6 - 0x46 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        uVar4 = (uVar4 ^ 0xffe0) + 0x2c;
      }
    }
    uVar2 = (ushort)uVar4;
    sVar3 = (uVar2 & 7) + ((ushort)uVar5 & 7) * 8;
    if ((((uVar18 & 0x3ff) == 0) && ((ushort)uVar5 < 8)) && (uVar2 < 0x10)) {
      if (7 < uVar2) {
        sVar3 = sVar3 + 0x40;
      }
    }
    else {
      iVar14 = ((uVar5 & 0xffff) >> 3) * 3 + ((uVar4 & 0xffff) >> 3);
      sVar3 = sVar3 + ((ushort)(0x520d40 >> ((char)iVar14 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar14 * 0x40 + 0x40;
    }
    *(short *)((long)local_c0 + 0xc) = sVar3;
    *num_commands = *num_commands + local_120;
    position = uVar21 + uVar11;
    uVar9 = local_50;
    if (position < local_50) {
      uVar9 = position;
    }
    uVar20 = uVar11 + 2;
    if (local_100 < uVar21 >> 2) {
      uVar18 = position + local_100 * -4;
      if (uVar18 < uVar20) {
        uVar18 = uVar20;
      }
      uVar20 = uVar18;
      if (uVar9 < uVar18) {
        uVar20 = uVar9;
      }
    }
    uVar11 = uVar21 * 2 + uVar11 + local_58;
    for (; uVar20 < uVar9; uVar20 = uVar20 + 1) {
      *(uint *)(lVar7 + (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                (uVar20 & ringbuffer_mask)) *
                                                      -0x42e1ca5843000000) >> 0x30) +
                                ((uint)uVar20 & 8) & 0xffff) * 4) = (uint)uVar20;
    }
    local_c0 = local_c0 + 2;
    local_120 = 0;
    uVar9 = local_70;
  } while( true );
  lVar7 = lVar7 + -8;
  uVar21 = uVar21 + 1;
  goto LAB_0010faef;
code_r0x0010fc00:
  lVar22 = lVar22 + -8;
  uVar15 = uVar15 + 1;
  goto LAB_0010fbee;
code_r0x0010fe69:
  lVar17 = lVar17 + -8;
  uVar16 = uVar16 + 1;
  goto LAB_0010fe4e;
code_r0x0010ff6a:
  lVar22 = lVar22 + -8;
  uVar8 = uVar8 + 1;
  goto LAB_0010ff56;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}